

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adynarray.c
# Opt level: O3

void * private_ACUtils_ADynArray_constructWithAllocator
                 (size_t typeSize,ACUtilsReallocator reallocator,ACUtilsDeallocator deallocator)

{
  undefined8 *puVar1;
  void *pvVar2;
  undefined8 *puVar3;
  private_ACUtils_DynArray_Prototype *prototype;
  
  if (deallocator == (ACUtilsDeallocator)0x0 || reallocator == (ACUtilsReallocator)0x0) {
    puVar3 = (undefined8 *)0x0;
  }
  else {
    puVar1 = (undefined8 *)(*reallocator)((void *)0x0,0x30);
    puVar3 = (undefined8 *)0x0;
    if (puVar1 != (undefined8 *)0x0) {
      *puVar1 = reallocator;
      puVar1[1] = deallocator;
      puVar1[5] = 0;
      puVar1[2] = private_ACUtils_ADynArray_growStrategyDefault;
      puVar1[3] = 0;
      puVar1[4] = 8;
      pvVar2 = (*reallocator)((void *)0x0,typeSize << 3);
      puVar1[5] = pvVar2;
      puVar3 = puVar1;
      if (pvVar2 == (void *)0x0) {
        (*(code *)puVar1[1])(0);
        (*(code *)puVar1[1])(puVar1);
        puVar3 = (undefined8 *)0x0;
      }
    }
  }
  return puVar3;
}

Assistant:

ACUTILS_HD_FUNC void* private_ACUtils_ADynArray_constructWithAllocator(size_t typeSize, ACUtilsReallocator reallocator,
                                                                       ACUtilsDeallocator deallocator)
{
    struct private_ACUtils_DynArray_Prototype* prototype;
    if(reallocator == NULL || deallocator == NULL)
        return NULL;
    prototype = (struct private_ACUtils_DynArray_Prototype*) reallocator(NULL, sizeof(struct private_ACUtils_DynArray_Prototype));
    if(prototype != NULL) {
        struct private_ACUtils_DynArray_Prototype tmpPrototype = {reallocator, deallocator};
        memcpy(prototype, &tmpPrototype, sizeof(struct private_ACUtils_DynArray_Prototype));
        prototype->growStrategy = private_ACUtils_ADynArray_growStrategyDefault;
        prototype->size = 0;
        prototype->capacity = prototype->growStrategy(prototype->size, typeSize);
        prototype->buffer = (char*) prototype->reallocator(NULL, prototype->capacity * typeSize);
        if(prototype->buffer == NULL) {
            private_ACUtils_ADynArray_destruct(prototype);
            return NULL;
        }
    }
    return prototype;
}